

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,MethodPrototypeSymbol *symbol)

{
  bool bVar1;
  SubroutineSymbol *pSVar2;
  Symbol *in_RSI;
  DiagnosticVisitor *in_RDI;
  Scope *scope;
  SubroutineSymbol *sub;
  MethodPrototypeSymbol *in_stack_00000138;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffffb8;
  MethodPrototypeSymbol *in_stack_ffffffffffffffc0;
  Symbol *this_00;
  SubroutineSymbol *in_stack_ffffffffffffffd8;
  Symbol *scope_00;
  Compilation *in_stack_ffffffffffffffe0;
  
  bVar1 = handleDefault<slang::ast::MethodPrototypeSymbol>(in_RDI,in_stack_ffffffffffffffc0);
  if (bVar1) {
    pSVar2 = MethodPrototypeSymbol::getSubroutine(in_stack_00000138);
    if (pSVar2 != (SubroutineSymbol *)0x0) {
      handle((DiagnosticVisitor *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    this_00 = in_RSI + 3;
    bitmask<slang::ast::MethodFlags>::bitmask
              ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffe6,InterfaceExtern);
    bVar1 = bitmask<slang::ast::MethodFlags>::has
                      ((bitmask<slang::ast::MethodFlags> *)this_00,in_stack_ffffffffffffffb8);
    if (bVar1) {
      scope_00 = in_RSI;
      SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this_00,
                 (MethodPrototypeSymbol **)in_stack_ffffffffffffffb8);
      Symbol::getParentScope(in_RSI);
      Compilation::noteCannotCache(in_stack_ffffffffffffffe0,(Scope *)scope_00);
    }
  }
  return;
}

Assistant:

void handle(const MethodPrototypeSymbol& symbol) {
        if (!handleDefault(symbol))
            return;

        if (auto sub = symbol.getSubroutine())
            handle(*sub);

        if (symbol.flags.has(MethodFlags::InterfaceExtern)) {
            externIfaceProtos.push_back(&symbol);

            auto scope = symbol.getParentScope();
            SLANG_ASSERT(scope);
            compilation.noteCannotCache(*scope);
        }
    }